

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

vw * VW::initialize(options_i *options,io_buf *model,bool skipModelLoad,
                   trace_message_t trace_listener,void *trace_context)

{
  byte bVar1;
  byte bVar2;
  byte in_DL;
  options_i *in_RSI;
  long *in_RDI;
  exception *e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_initial_regressor_files;
  io_buf localModel;
  vw *all;
  io_buf *in_stack_00000410;
  vw *in_stack_00000418;
  options_i *in_stack_00000420;
  void *in_stack_00001770;
  trace_message_t in_stack_00001778;
  options_i *in_stack_00001780;
  io_buf *in_stack_fffffffffffffe20;
  value_type *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  vw *in_stack_fffffffffffffe40;
  string *key;
  vw *in_stack_fffffffffffffe50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe68;
  allocator *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe70;
  string local_188 [39];
  undefined1 local_161 [32];
  undefined1 in_stack_fffffffffffffebf;
  io_buf *in_stack_fffffffffffffec0;
  vw *in_stack_fffffffffffffec8;
  options_i *in_stack_fffffffffffffed0;
  allocator local_121;
  string local_120 [72];
  options_i local_d8 [21];
  vw *local_30;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  local_30 = parse_args(in_stack_00001780,in_stack_00001778,in_stack_00001770);
  io_buf::io_buf((io_buf *)0x17ca84);
  if (in_RSI == (options_i *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    __x = &local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"input_feature_regularizer",__x);
    bVar2 = (**(code **)(*in_RDI + 8))(in_RDI,local_120);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    if ((bVar2 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                  in_stack_fffffffffffffe28);
    }
    in_stack_fffffffffffffe50 = local_30;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffe70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__x);
    read_regressor_file(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                        (io_buf *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    in_RSI = local_d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  }
  load_header_merge_options(in_stack_00000420,in_stack_00000418,in_stack_00000410);
  parse_modules(in_RSI,(vw *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
  parse_sources(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                (bool)in_stack_fffffffffffffebf);
  (**(code **)(*in_RDI + 0x38))();
  key = (string *)local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_161 + 1),"help",(allocator *)key);
  config::options_i::get_typed_option<bool>((options_i *)in_stack_fffffffffffffe50,key);
  bVar1 = config::typed_option<bool>::value((typed_option<bool> *)in_stack_fffffffffffffe20);
  std::__cxx11::string::~string((string *)(local_161 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_161);
  if ((bVar1 & 1) != 0) {
    (**(code **)(*in_RDI + 0x10))(local_188);
    std::operator<<((ostream *)&std::cout,local_188);
    std::__cxx11::string::~string(local_188);
    exit(0);
  }
  LEARNER::learner<char,_char>::init_driver((learner<char,_char> *)0x17ce36);
  io_buf::~io_buf(in_stack_fffffffffffffe20);
  return local_30;
}

Assistant:

vw* initialize(
    options_i& options, io_buf* model, bool skipModelLoad, trace_message_t trace_listener, void* trace_context)
{
  vw& all = parse_args(options, trace_listener, trace_context);

  try
  {
    // if user doesn't pass in a model, read from options
    io_buf localModel;
    if (!model)
    {
      std::vector<std::string> all_initial_regressor_files(all.initial_regressors);
      if (options.was_supplied("input_feature_regularizer"))
      {
        all_initial_regressor_files.push_back(all.per_feature_regularizer_input);
      }
      read_regressor_file(all, all_initial_regressor_files, localModel);
      model = &localModel;
    }

    // Loads header of model files and loads the command line options into the options object.
    load_header_merge_options(options, all, *model);

    parse_modules(options, all);

    parse_sources(options, all, *model, skipModelLoad);

    options.check_unregistered();

    // upon direct query for help -- spit it out to stdout;
    if (options.get_typed_option<bool>("help").value())
    {
      cout << options.help();
      exit(0);
    }

    all.l->init_driver();

    return &all;
  }
  catch (std::exception& e)
  {
    all.trace_message << "Error: " << e.what() << endl;
    finish(all);
    throw;
  }
  catch (...)
  {
    finish(all);
    throw;
  }
}